

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall cs::runtime_error::~runtime_error(runtime_error *this)

{
  exception *in_RDI;
  
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  std::exception::~exception(in_RDI);
  return;
}

Assistant:

~runtime_error() override = default;